

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v7::format_system_error(v7 *this,buffer<char> *out,int error_code,string_view message)

{
  char ***pppcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char ***pppcVar5;
  undefined4 in_register_00000014;
  uint uVar6;
  buffer<char> *buf;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  char *system_message;
  char **local_270;
  undefined **local_268;
  char **local_260;
  char **local_258;
  undefined **local_248;
  char **local_240;
  char **ppcStack_238;
  char **local_230;
  char *local_228 [63];
  
  pppcVar5 = (char ***)message.data_;
  local_240 = local_228;
  local_248 = &PTR_grow_0014e470;
  local_230 = (char **)0x1f4;
  ppcStack_238 = (char **)0x1f4;
  do {
    local_270 = local_240;
    uVar6 = (uint)out;
    local_268 = (undefined **)CONCAT44(local_268._4_4_,uVar6);
    local_258 = ppcStack_238;
    local_260 = (char **)&local_270;
    iVar3 = detail::anon_func::dispatcher::run((dispatcher *)&local_268);
    if (iVar3 == 0x22) {
      pppcVar1 = (char ***)((long)ppcStack_238 * 2);
      if (local_230 < pppcVar1) {
        (*(code *)*local_248)(&local_248,pppcVar1);
      }
      ppcStack_238 = (char **)pppcVar1;
      if (local_230 < pppcVar1) {
        ppcStack_238 = local_230;
      }
      iVar3 = 0;
      bVar2 = true;
    }
    else {
      if (iVar3 == 0) {
        local_258 = local_270;
        args.field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_268;
        args.desc_ = 0xcd;
        format_str.size_ = 6;
        format_str.data_ = "{}: {}";
        local_268 = (undefined **)CONCAT44(in_register_00000014,error_code);
        local_260 = (char **)pppcVar5;
        detail::vformat_to<char>((buffer<char> *)this,format_str,args,(locale_ref)0x0);
        iVar3 = 1;
      }
      else {
        iVar3 = 2;
      }
      bVar2 = false;
    }
  } while (iVar3 == 0);
  if (iVar3 == 2) {
    bVar2 = true;
  }
  if (local_240 != local_228) {
    operator_delete(local_240,(ulong)local_230);
  }
  if (bVar2) {
    *(undefined8 *)(this + 0x10) = 0;
    uVar4 = -uVar6;
    if (0 < (int)uVar6) {
      uVar4 = uVar6;
    }
    uVar6 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    if (pppcVar5 <=
        (char ***)
        (0x1ec - (((ulong)out >> 0x1f & 1) +
                 (ulong)((uint)*(ushort *)(detail::bsr2log10(int)::data + (ulong)uVar6 * 2) -
                        (uint)(uVar4 < *(uint *)(detail::basic_data<void>::
                                                 zero_or_powers_of_10_32_new +
                                                (ulong)*(ushort *)
                                                        (detail::bsr2log10(int)::data +
                                                        (ulong)uVar6 * 2) * 4)))))) {
      ppcStack_238 = (char **)&detail::
                               format_error_code(fmt::v7::detail::buffer<char>&,int,fmt::v7::basic_string_view<char>)
                               ::SEP;
      args_00.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_248;
      args_00.desc_ = 0xcd;
      format_str_00.size_ = 4;
      format_str_00.data_ = "{}{}";
      local_248 = (undefined **)CONCAT44(in_register_00000014,error_code);
      local_240 = (char **)pppcVar5;
      detail::vformat_to<char>((buffer<char> *)this,format_str_00,args_00,(locale_ref)0x0);
    }
    ppcStack_238 = (char **)((ulong)out & 0xffffffff);
    local_248 = (undefined **)0x13ae4a;
    args_01.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_248;
    args_01.desc_ = 0x1c;
    format_str_01.size_ = 4;
    format_str_01.data_ = "{}{}";
    detail::vformat_to<char>((buffer<char> *)this,format_str_01,args_01,(locale_ref)0x0);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }